

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

TestSpecParser * __thiscall Catch::TestSpecParser::parse(TestSpecParser *this,string *arg)

{
  pointer puVar1;
  bool bVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this->m_mode = None;
  this->m_exclusion = false;
  (*this->m_tagAliases->_vptr_ITagAliasRegistry[3])(&local_38,this->m_tagAliases,arg);
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_arg,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  puVar1 = (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (&this->m_substring,(this->m_arg)._M_string_length);
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (&this->m_patternName,(this->m_arg)._M_string_length);
  this->m_pos = 0;
  this->m_realPatternPos = 0;
  if ((this->m_arg)._M_string_length != 0) {
    uVar3 = 0;
    do {
      bVar2 = visitChar(this,(this->m_arg)._M_dataplus._M_p[uVar3]);
      if (!bVar2) {
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&(this->m_testSpec).m_invalidArgs,arg);
        break;
      }
      uVar3 = this->m_pos + 1;
      this->m_pos = uVar3;
    } while (uVar3 < (this->m_arg)._M_string_length);
  }
  endMode(this);
  return this;
}

Assistant:

TestSpecParser &TestSpecParser::parse(std::string const &arg) {
    m_mode = None;
    m_exclusion = false;
    m_arg = m_tagAliases->expandAliases(arg);
    m_escapeChars.clear();
    m_substring.reserve(m_arg.size());
    m_patternName.reserve(m_arg.size());
    m_realPatternPos = 0;

    for (m_pos = 0; m_pos < m_arg.size(); ++m_pos)
      // if visitChar fails
      if (!visitChar(m_arg[m_pos])) {
        m_testSpec.m_invalidArgs.push_back(arg);
        break;
      }
    endMode();
    return *this;
  }